

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

void __thiscall
TesterThread::TesterThread
          (TesterThread *this,
          vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
          *all_threads,int id)

{
  this->_vptr_TesterThread = (_func_int **)&PTR__TesterThread_00156e68;
  this->all_threads_ = all_threads;
  (this->lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 8) = 0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  this->id_ = id;
  AllocatorState::AllocatorState(&this->rnd_,id + 1);
  (this->passed_).super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->passed_).super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heap_).super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->passed_).super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap_).super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap_).super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->heap_size_ = 0;
  return;
}

Assistant:

TesterThread(std::vector<std::unique_ptr<TesterThread>>& all_threads, int id)
    : all_threads_(all_threads),
      id_(id),
      rnd_(id+1),
      heap_size_(0) {
  }